

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O0

Clause * __thiscall
Inferences::Instantiation::ResultFn::operator()(ResultFn *this,Substitution *sub)

{
  bool bVar1;
  Inference *this_00;
  Clause *pCVar2;
  undefined8 *in_RDI;
  Literal *curr;
  StlIter __end2;
  StlIter __begin2;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range2;
  RStack<Literal_*> resLits;
  StlIter *in_stack_ffffffffffffff08;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff10;
  Clause *in_stack_ffffffffffffff20;
  Substitution *in_stack_ffffffffffffff48;
  Clause *in_stack_ffffffffffffff50;
  Inference *in_stack_ffffffffffffff78;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff80;
  undefined1 local_40 [24];
  undefined1 *local_28;
  
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_ffffffffffffff10);
  Kernel::Clause::iterLits(in_stack_ffffffffffffff20);
  local_28 = local_40;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)in_stack_ffffffffffffff08);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = Lib::operator!=((StlIter *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (!bVar1) break;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator*((StlIter *)0x8001e2);
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x800206);
    Kernel::SubstHelper::apply<Kernel::Substitution>
              ((Literal *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Lib::Stack<Kernel::Literal_*>::push
              (in_stack_ffffffffffffff10,(Literal *)in_stack_ffffffffffffff08);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++((StlIter *)in_stack_ffffffffffffff10);
  }
  this_00 = (Inference *)
            Lib::
            Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x800273);
  Kernel::GeneratingInference1::GeneratingInference1
            ((GeneratingInference1 *)&stack0xffffffffffffff48,INSTANTIATION,(Clause *)*in_RDI);
  Kernel::Inference::Inference(this_00,(GeneratingInference1 *)in_stack_ffffffffffffff08);
  pCVar2 = Kernel::Clause::fromStack(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff58);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            in_stack_ffffffffffffff50);
  return pCVar2;
}

Assistant:

Clause* operator()(Substitution sub)
  {
    RStack<Literal*> resLits;
    for(Literal* curr : _cl->iterLits()){
      resLits->push(SubstHelper::apply(curr,sub));
    }

    return Clause::fromStack(*resLits,GeneratingInference1(InferenceRule::INSTANTIATION,_cl));
  }